

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xhtmlAttrListDumpOutput(xmlSaveCtxtPtr ctxt,xmlAttrPtr cur)

{
  xmlOutputBufferPtr out;
  _xmlNode *p_Var1;
  int iVar2;
  xmlNodePtr pxVar3;
  xmlOutputBufferPtr buf;
  xmlNodePtr parent;
  xmlAttrPtr id;
  xmlAttrPtr name;
  xmlAttrPtr lang;
  xmlAttrPtr xml_lang;
  xmlAttrPtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  lang = (xmlAttrPtr)0x0;
  name = (xmlAttrPtr)0x0;
  id = (xmlAttrPtr)0x0;
  parent = (xmlNodePtr)0x0;
  if (cur != (xmlAttrPtr)0x0) {
    out = ctxt->buf;
    p_Var1 = cur->parent;
    for (xml_lang = cur; xml_lang != (xmlAttrPtr)0x0; xml_lang = xml_lang->next) {
      if ((xml_lang->ns == (xmlNs *)0x0) && (iVar2 = xmlStrEqual(xml_lang->name,"id"), iVar2 != 0))
      {
        parent = (xmlNodePtr)xml_lang;
      }
      else if ((xml_lang->ns == (xmlNs *)0x0) &&
              (iVar2 = xmlStrEqual(xml_lang->name,"name"), iVar2 != 0)) {
        id = xml_lang;
      }
      else if ((xml_lang->ns == (xmlNs *)0x0) &&
              (iVar2 = xmlStrEqual(xml_lang->name,"lang"), iVar2 != 0)) {
        name = xml_lang;
      }
      else if ((xml_lang->ns == (xmlNs *)0x0) ||
              ((iVar2 = xmlStrEqual(xml_lang->name,"lang"), iVar2 == 0 ||
               (iVar2 = xmlStrEqual(xml_lang->ns->prefix,"xml"), iVar2 == 0)))) {
        if ((xml_lang->ns == (xmlNs *)0x0) &&
           ((((xml_lang->children == (_xmlNode *)0x0 ||
              (xml_lang->children->content == (xmlChar *)0x0)) ||
             (*xml_lang->children->content == '\0')) &&
            (iVar2 = htmlIsBooleanAttr(xml_lang->name), iVar2 != 0)))) {
          if (xml_lang->children != (_xmlNode *)0x0) {
            xmlFreeNode(xml_lang->children);
          }
          pxVar3 = xmlNewText(xml_lang->name);
          xml_lang->children = pxVar3;
          if (xml_lang->children != (_xmlNode *)0x0) {
            xml_lang->children->parent = (_xmlNode *)xml_lang;
          }
        }
      }
      else {
        lang = xml_lang;
      }
      xmlAttrDumpOutput(ctxt,xml_lang);
    }
    if ((((id != (xmlAttrPtr)0x0) && (parent == (xmlNodePtr)0x0)) &&
        ((p_Var1 != (_xmlNode *)0x0 && (p_Var1->name != (xmlChar *)0x0)))) &&
       ((((iVar2 = xmlStrEqual(p_Var1->name,"a"), iVar2 != 0 ||
          (iVar2 = xmlStrEqual(p_Var1->name,"p"), iVar2 != 0)) ||
         ((iVar2 = xmlStrEqual(p_Var1->name,"div"), iVar2 != 0 ||
          (((iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"img"), iVar2 != 0 ||
            (iVar2 = xmlStrEqual(p_Var1->name,"map"), iVar2 != 0)) ||
           (iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"applet"), iVar2 != 0)))))) ||
        (((iVar2 = xmlStrEqual(p_Var1->name,"form"), iVar2 != 0 ||
          (iVar2 = xmlStrEqual(p_Var1->name,"frame"), iVar2 != 0)) ||
         (iVar2 = xmlStrEqual(p_Var1->name,(xmlChar *)"iframe"), iVar2 != 0)))))) {
      xmlOutputBufferWrite(out,5," id=\"");
      xmlAttrSerializeContent(out,id);
      xmlOutputBufferWrite(out,1,"\"");
    }
    if ((name == (xmlAttrPtr)0x0) || (lang != (xmlAttrPtr)0x0)) {
      if ((lang != (xmlAttrPtr)0x0) && (name == (xmlAttrPtr)0x0)) {
        xmlOutputBufferWrite(out,7," lang=\"");
        xmlAttrSerializeContent(out,lang);
        xmlOutputBufferWrite(out,1,"\"");
      }
    }
    else {
      xmlOutputBufferWrite(out,0xb," xml:lang=\"");
      xmlAttrSerializeContent(out,name);
      xmlOutputBufferWrite(out,1,"\"");
    }
  }
  return;
}

Assistant:

static void
xhtmlAttrListDumpOutput(xmlSaveCtxtPtr ctxt, xmlAttrPtr cur) {
    xmlAttrPtr xml_lang = NULL;
    xmlAttrPtr lang = NULL;
    xmlAttrPtr name = NULL;
    xmlAttrPtr id = NULL;
    xmlNodePtr parent;
    xmlOutputBufferPtr buf;

    if (cur == NULL) return;
    buf = ctxt->buf;
    parent = cur->parent;
    while (cur != NULL) {
	if ((cur->ns == NULL) && (xmlStrEqual(cur->name, BAD_CAST "id")))
	    id = cur;
	else
	if ((cur->ns == NULL) && (xmlStrEqual(cur->name, BAD_CAST "name")))
	    name = cur;
	else
	if ((cur->ns == NULL) && (xmlStrEqual(cur->name, BAD_CAST "lang")))
	    lang = cur;
	else
	if ((cur->ns != NULL) && (xmlStrEqual(cur->name, BAD_CAST "lang")) &&
	    (xmlStrEqual(cur->ns->prefix, BAD_CAST "xml")))
	    xml_lang = cur;
	else if ((cur->ns == NULL) &&
		 ((cur->children == NULL) ||
		  (cur->children->content == NULL) ||
		  (cur->children->content[0] == 0)) &&
		 (htmlIsBooleanAttr(cur->name))) {
	    if (cur->children != NULL)
		xmlFreeNode(cur->children);
	    cur->children = xmlNewText(cur->name);
	    if (cur->children != NULL)
		cur->children->parent = (xmlNodePtr) cur;
	}
        xmlAttrDumpOutput(ctxt, cur);
	cur = cur->next;
    }
    /*
     * C.8
     */
    if ((name != NULL) && (id == NULL)) {
	if ((parent != NULL) && (parent->name != NULL) &&
	    ((xmlStrEqual(parent->name, BAD_CAST "a")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "p")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "div")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "img")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "map")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "applet")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "form")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "frame")) ||
	     (xmlStrEqual(parent->name, BAD_CAST "iframe")))) {
	    xmlOutputBufferWrite(buf, 5, " id=\"");
	    xmlAttrSerializeContent(buf, name);
	    xmlOutputBufferWrite(buf, 1, "\"");
	}
    }
    /*
     * C.7.
     */
    if ((lang != NULL) && (xml_lang == NULL)) {
	xmlOutputBufferWrite(buf, 11, " xml:lang=\"");
	xmlAttrSerializeContent(buf, lang);
	xmlOutputBufferWrite(buf, 1, "\"");
    } else
    if ((xml_lang != NULL) && (lang == NULL)) {
	xmlOutputBufferWrite(buf, 7, " lang=\"");
	xmlAttrSerializeContent(buf, xml_lang);
	xmlOutputBufferWrite(buf, 1, "\"");
    }
}